

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeLocation.cpp
# Opt level: O1

XMLCh * xercesc_4_0::allocate(XMLCh *href)

{
  short *psVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  long lVar4;
  XMLCh *target;
  
  if (href == (XMLCh *)0x0) {
    lVar4 = 2;
  }
  else {
    lVar3 = 0;
    do {
      lVar4 = lVar3 + 2;
      psVar1 = (short *)((long)href + lVar3);
      lVar3 = lVar4;
    } while (*psVar1 != 0);
  }
  iVar2 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                    (XMLPlatformUtils::fgMemoryManager,lVar4);
  target = (XMLCh *)CONCAT44(extraout_var,iVar2);
  XMLString::copyString(target,href);
  XMLPlatformUtils::removeDotDotSlash(target,XMLPlatformUtils::fgMemoryManager);
  return target;
}

Assistant:

const XMLCh *allocate(const XMLCh *href){
    XMLCh *allocated;
    XMLSize_t length = XMLString::stringLen(href);
    allocated = (XMLCh*)XMLPlatformUtils::fgMemoryManager->allocate((length+1) * sizeof(XMLCh));
    XMLString::copyString(allocated, href);
    XMLPlatformUtils::removeDotDotSlash(allocated);

    return allocated;
}